

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O0

bool __thiscall
cmVariableWatchCommand::InitialPass
          (cmVariableWatchCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  cmVariableWatchCallbackData *this_00;
  cmake *this_01;
  cmVariableWatch *this_02;
  cmVariableWatchCallbackData *data;
  string local_238;
  undefined1 local_218 [8];
  ostringstream ostr;
  string local_a0 [8];
  string command;
  string variable;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmVariableWatchCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"must be called with at least one argument.",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
  }
  else {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,0);
    std::__cxx11::string::string((string *)(command.field_2._M_local_buf + 8),(string *)pvVar3);
    std::__cxx11::string::string(local_a0);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
    if (1 < sVar2) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,1);
      std::__cxx11::string::operator=(local_a0,(string *)pvVar3);
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&command.field_2 + 8),"CMAKE_CURRENT_LIST_FILE");
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
      poVar4 = std::operator<<((ostream *)local_218,"cannot be set on the variable: ");
      std::operator<<(poVar4,(string *)(command.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
    }
    else {
      this_00 = (cmVariableWatchCallbackData *)operator_new(0x28);
      cmVariableWatchCallbackData::cmVariableWatchCallbackData(this_00);
      this_00->InCallback = false;
      std::__cxx11::string::operator=((string *)&this_00->Command,local_a0);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&this->WatchedVariables,(value_type *)((long)&command.field_2 + 8));
      this_01 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
      this_02 = cmake::GetVariableWatch(this_01);
      bVar1 = cmVariableWatch::AddWatch
                        (this_02,(string *)((long)&command.field_2 + 8),
                         cmVariableWatchCommandVariableAccessed,this_00,
                         deleteVariableWatchCallbackData);
      if (bVar1) {
        this_local._7_1_ = 1;
      }
      else {
        deleteVariableWatchCallbackData(this_00);
        this_local._7_1_ = 0;
      }
    }
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string((string *)(command.field_2._M_local_buf + 8));
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmVariableWatchCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if ( args.size() < 1 )
    {
    this->SetError("must be called with at least one argument.");
    return false;
    }
  std::string variable = args[0];
  std::string command;
  if ( args.size() > 1 )
    {
    command = args[1];
    }
  if ( variable == "CMAKE_CURRENT_LIST_FILE" )
    {
    std::ostringstream ostr;
    ostr << "cannot be set on the variable: " << variable;
    this->SetError(ostr.str());
    return false;
    }

  cmVariableWatchCallbackData* data = new cmVariableWatchCallbackData;

  data->InCallback = false;
  data->Command = command;

  this->WatchedVariables.insert(variable);
  if ( !this->Makefile->GetCMakeInstance()->GetVariableWatch()->AddWatch(
          variable, cmVariableWatchCommandVariableAccessed,
          data, deleteVariableWatchCallbackData) )
    {
    deleteVariableWatchCallbackData(data);
    return false;
    }

  return true;
}